

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall MapLoader::MapLoader(MapLoader *this)

{
  MapLoader *this_local;
  
  std::__cxx11::string::string((string *)&this->filePath);
  std::__cxx11::string::operator=((string *)&this->filePath,"");
  this->nodeCount = 0;
  this->map = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  return;
}

Assistant:

MapLoader::MapLoader() {
  filePath = "";
  nodeCount = 0;
  map = nullptr; //initialize the graph to nullptr

}